

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O1

Element QCborContainerPrivate::elementFromValue(QCborValue *value)

{
  undefined4 uVar1;
  Element *pEVar2;
  undefined4 uVar3;
  Element *pEVar4;
  anon_union_8_2_4ee71171_for_Element_0 aVar5;
  ulong uVar6;
  Element EVar7;
  Element EVar8;
  
  aVar5 = (anon_union_8_2_4ee71171_for_Element_0)value->n;
  if ((-1 < aVar5.value) && (value->container != (QCborContainerPrivate *)0x0)) {
    pEVar2 = (value->container->elements).d.ptr;
    pEVar4 = pEVar2 + aVar5.value;
    uVar1 = pEVar4->type;
    uVar3 = pEVar4->flags;
    EVar7.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
         (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)uVar3;
    EVar7.type = uVar1;
    EVar7.field_0.value = pEVar2[aVar5.value].field_0.value;
    return EVar7;
  }
  uVar6 = (ulong)(uint)value->t;
  if (value->container != (QCborContainerPrivate *)0x0) {
    uVar6 = uVar6 | 0x100000000;
    aVar5.container = value->container;
  }
  EVar8.type = (int)uVar6;
  EVar8.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
  super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
       (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
       (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)(int)(uVar6 >> 0x20);
  EVar8.field_0.value = aVar5.value;
  return EVar8;
}

Assistant:

static QtCbor::Element elementFromValue(const QCborValue &value)
    {
        if (value.n >= 0 && value.container)
            return value.container->elements.at(value.n);

        QtCbor::Element e;
        e.value = value.n;
        e.type = value.t;
        if (value.container) {
            e.container = value.container;
            e.flags = QtCbor::Element::IsContainer;
        }
        return e;
    }